

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesFirmwareFlash(zes_firmware_handle_t hFirmware,void *pImage,uint32_t size)

{
  zes_pfnFirmwareFlash_t pfnFlash;
  ze_result_t result;
  uint32_t size_local;
  void *pImage_local;
  zes_firmware_handle_t hFirmware_local;
  
  pfnFlash._0_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011ccd0 != (code *)0x0) {
    pfnFlash._0_4_ = (*DAT_0011ccd0)(hFirmware,pImage,size);
  }
  return (ze_result_t)pfnFlash;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFirmwareFlash(
        zes_firmware_handle_t hFirmware,                ///< [in] Handle for the component.
        void* pImage,                                   ///< [in] Image of the new firmware to flash.
        uint32_t size                                   ///< [in] Size of the flash image.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnFlash = context.zesDdiTable.Firmware.pfnFlash;
        if( nullptr != pfnFlash )
        {
            result = pfnFlash( hFirmware, pImage, size );
        }
        else
        {
            // generic implementation
        }

        return result;
    }